

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

int32_t BinaryenConstGetValueI32(BinaryenExpressionRef expr)

{
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xab7,"int32_t BinaryenConstGetValueI32(BinaryenExpressionRef)");
  }
  if (*(long *)(expr + 2) == 2) {
    return *(int32_t *)(expr + 1);
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

int32_t BinaryenConstGetValueI32(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return static_cast<Const*>(expression)->value.geti32();
}